

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_setmetatable(lua_State *L,int objindex)

{
  uint uVar1;
  TValue *pTVar2;
  GCObject *o;
  Table *mt;
  
  pTVar2 = index2addr(L,objindex);
  if (L->top[-1].tt_ == 0) {
    mt = (Table *)0x0;
  }
  else {
    mt = (Table *)L->top[-1].value_.gc;
  }
  uVar1 = pTVar2->tt_ & 0xf;
  if ((ulong)uVar1 == 7) {
    *(Table **)((pTVar2->value_).f + 0x10) = mt;
  }
  else {
    if (uVar1 != 5) {
      L->l_G->mt[uVar1] = mt;
      goto LAB_0010fb4f;
    }
    *(Table **)((pTVar2->value_).f + 0x28) = mt;
  }
  if (mt != (Table *)0x0) {
    o = (pTVar2->value_).gc;
    if (((o->marked & 4) != 0) && ((mt->marked & 3) != 0)) {
      luaC_barrier_(L,o,(GCObject *)mt);
      o = (pTVar2->value_).gc;
    }
    luaC_checkfinalizer(L,o,mt);
  }
LAB_0010fb4f:
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable (lua_State *L, int objindex) {
  TValue *obj;
  Table *mt;
  lua_lock(L);
  api_checknelems(L, 1);
  obj = index2addr(L, objindex);
  if (ttisnil(L->top - 1))
    mt = NULL;
  else {
    api_check(L, ttistable(L->top - 1), "table expected");
    mt = hvalue(L->top - 1);
  }
  switch (ttnov(obj)) {
    case LUA_TTABLE: {
      hvalue(obj)->metatable = mt;
      if (mt) {
        luaC_objbarrier(L, gcvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      }
      break;
    }
    case LUA_TUSERDATA: {
      uvalue(obj)->metatable = mt;
      if (mt) {
        luaC_objbarrier(L, uvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      }
      break;
    }
    default: {
      G(L)->mt[ttnov(obj)] = mt;
      break;
    }
  }
  L->top--;
  lua_unlock(L);
  return 1;
}